

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_quad_to_line<charls::transform_hp1<unsigned_char>,unsigned_char>
               (quad<unsigned_char> *source,size_t pixel_stride_in,uchar *destination,
               size_t pixel_stride,transform_hp1<unsigned_char> *transform,uint32_t mask)

{
  ulong uVar1;
  triplet<unsigned_char> triplet_value;
  unsigned_long *puVar2;
  anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1 local_50;
  transform_hp1<unsigned_char> local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  uint local_4c;
  quad<unsigned_char> color_transformed;
  quad<unsigned_char> color;
  size_t i;
  unsigned_long pixel_count;
  uint32_t mask_local;
  transform_hp1<unsigned_char> *transform_local;
  size_t pixel_stride_local;
  uchar *destination_local;
  size_t pixel_stride_in_local;
  quad<unsigned_char> *source_local;
  
  transform_local = (transform_hp1<unsigned_char> *)pixel_stride;
  pixel_stride_local = (size_t)destination;
  destination_local = (uchar *)pixel_stride_in;
  pixel_stride_in_local = (size_t)source;
  puVar2 = std::min<unsigned_long>
                     ((unsigned_long *)&transform_local,(unsigned_long *)&destination_local);
  uVar1 = *puVar2;
  for (_color_transformed = 0; _color_transformed < uVar1;
      _color_transformed = _color_transformed + 1) {
    local_4c = *(uint *)(pixel_stride_in_local + _color_transformed * 4);
    triplet_value =
         transform_hp1<unsigned_char>::operator()
                   (transform,local_4c & 0xff & mask,local_4c >> 8 & 0xff & mask,
                    local_4c >> 0x10 & 0xff & mask);
    quad<unsigned_char>::quad
              ((quad<unsigned_char> *)&local_50,triplet_value,local_4c >> 0x18 & mask);
    *(anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1 *)
     (pixel_stride_local + _color_transformed) = local_50;
    transform_local[pixel_stride_local + _color_transformed] = local_4f;
    *(undefined1 *)(pixel_stride_local + _color_transformed + (long)transform_local * 2) = local_4e;
    *(undefined1 *)(pixel_stride_local + _color_transformed + (long)transform_local * 3) = local_4d;
  }
  return;
}

Assistant:

void transform_quad_to_line(const quad<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                            const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const quad<PixelType> color{source[i]};
        const quad<PixelType> color_transformed(transform(color.v1 & mask, color.v2 & mask, color.v3 & mask),
                                                color.v4 & mask);

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
        destination[i + 3 * pixel_stride] = color_transformed.v4;
    }
}